

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O2

void __thiscall ImGuiWS::Impl::Impl(Impl *this)

{
  XorRlePerDrawListWithVtxOffset *this_00;
  
  (this->nConnected).super___atomic_base<int>._M_i = 0;
  (this->worker)._M_id._M_thread = 0;
  (this->mutex)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->mutex)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->mutex)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->mutex)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->mutex)._M_impl._M_rwlock + 0x20) = 0;
  (this->mutex)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->mutex)._M_impl._M_rwlock + 0x30) = 0;
  Data::Data(&this->dataWrite);
  Data::Data(&this->dataRead);
  Events::Events(&this->events);
  Incppect<false>::Incppect();
  (this->handlerDisconnect).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->handlerDisconnect)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->handlerDisconnect).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->handlerDisconnect).super__Function_base._M_functor + 8) = 0;
  (this->handlerConnect).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->handlerConnect)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->handlerConnect).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->handlerConnect).super__Function_base._M_functor + 8) = 0;
  this_00 = (XorRlePerDrawListWithVtxOffset *)operator_new(0x58);
  ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset::XorRlePerDrawListWithVtxOffset(this_00);
  (this->compressorDrawData)._M_t.
  super___uniq_ptr_impl<ImDrawDataCompressor::Interface,_std::default_delete<ImDrawDataCompressor::Interface>_>
  ._M_t.
  super__Tuple_impl<0UL,_ImDrawDataCompressor::Interface_*,_std::default_delete<ImDrawDataCompressor::Interface>_>
  .super__Head_base<0UL,_ImDrawDataCompressor::Interface_*,_false>._M_head_impl =
       (Interface *)this_00;
  return;
}

Assistant:

Impl() : compressorDrawData(new ImDrawDataCompressor::XorRlePerDrawListWithVtxOffset()) {}